

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::token::Text::dump_abi_cxx11_(string *__return_storage_ptr__,Text *this)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Text *local_18;
  Text *this_local;
  
  local_18 = this;
  this_local = (Text *)__return_storage_ptr__;
  __rhs = get_text_abi_cxx11_(this);
  std::operator+(&local_38,"TEXT: \'",__rhs);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Text::dump() const {
    return "TEXT: '" + this->get_text() + "'";
}